

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitNTest_random_view_Test<char16_t>::TestBody(SplitNTest_random_view_Test<char16_t> *this)

{
  pointer pbVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  vector<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
  split_result;
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  data;
  unsigned_long local_e8;
  long *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_c0;
  container_type_conflict18 local_b0;
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_98;
  
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::RandomTestData(&local_98,L'\0',0,0);
  jessilib::
  split_n<std::vector,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t>
            (&local_b0,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )local_98.m_str._M_dataplus._M_p,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )(local_98.m_str._M_dataplus._M_p + local_98.m_str._M_string_length),L'\0',4);
  local_e0 = (long *)((long)local_b0.
                            super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b0.
                            super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_e8 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_d0,"split_result.size()","n + 1",(unsigned_long *)&local_e0,&local_e8
            );
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xb9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_e0 != (long *)0x0) {
      (**(code **)(*local_e0 + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  lVar2 = 0;
  lVar4 = 0;
  do {
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char16_t,std::char_traits<char16_t>>,std::__cxx11::u16string>
              ((internal *)local_d0,"split_result[index]","data.m_tokens[index]",
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
               ((long)&(local_b0.
                        super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_len + lVar2),
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               ((long)&((local_98.m_tokens.
                         super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    if (local_d0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      pcVar3 = "";
      if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
                 ,0xbb,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_e0 != (long *)0x0) {
        (**(code **)(*local_e0 + 8))();
      }
    }
    if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c8,local_c8);
    }
    pbVar1 = local_b0.
             super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = lVar4 + 0x20;
    lVar2 = lVar2 + 0x10;
  } while (lVar4 != 0x80);
  RandomTestData<char16_t,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  ::get_remainder((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                  local_d0,&local_98,4);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char16_t,std::char_traits<char16_t>>,std::__cxx11::u16string>
            ((internal *)&local_e0,"split_result[n]","data.get_remainder(n)",pbVar1 + 4,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                     *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0._M_allocated_capacity * 2 + 2);
  }
  if (local_e0._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)local_d0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)CONCAT71(local_d0._1_7_,local_d0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0._1_7_,local_d0[0]) + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if (local_b0.
      super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::allocator<std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(&local_98.m_tokens);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_98.m_str._M_dataplus._M_p != &local_98.m_str.field_2) {
    operator_delete(local_98.m_str._M_dataplus._M_p,
                    local_98.m_str.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_98.m_delim._M_dataplus._M_p != &local_98.m_delim.field_2) {
    operator_delete(local_98.m_delim._M_dataplus._M_p,
                    local_98.m_delim.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TYPED_TEST(SplitNTest, random_view) {
	RandomTestData<TypeParam> data{};
	constexpr size_t n = 4;
	std::vector<std::basic_string_view<TypeParam>> split_result = split_n_view(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}